

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O2

Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *
gimage::downscaleImage<unsigned_char>
          (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *__return_storage_ptr__,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,int factor)

{
  undefined4 uVar1;
  int kk;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uchar *puVar7;
  byte *pbVar8;
  long lVar9;
  int iVar10;
  int kk_1;
  int iVar11;
  long lVar12;
  int ii_1;
  ulong uVar13;
  uchar *puVar14;
  ulong uVar15;
  bool bVar16;
  long local_50;
  
  if (factor < 2) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image(__return_storage_ptr__,image);
  }
  else {
    uVar15 = (ulong)(uint)factor;
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::Image
              (__return_storage_ptr__,(long)(image->width + (uVar15 - 1)) / (long)uVar15,
               (long)((uVar15 - 1) + image->height) / (long)uVar15,image->depth);
    for (lVar6 = 0; lVar6 < image->depth; lVar6 = lVar6 + 1) {
      puVar14 = *__return_storage_ptr__->img[lVar6];
      local_50 = 0;
      lVar5 = local_50;
      while( true ) {
        local_50 = lVar5;
        lVar5 = uVar15 + local_50;
        if (image->height < lVar5) break;
        if (factor == 2) {
          lVar9 = 0;
          while( true ) {
            lVar3 = image->width;
            if (lVar3 < lVar9 + 2) break;
            puVar7 = image->img[lVar6][local_50];
            *puVar14 = (uchar)((uint)puVar7[lVar3 + 1 + lVar9] +
                               (uint)puVar7[lVar3 + lVar9] +
                               (uint)puVar7[lVar9 + 1] + (uint)puVar7[lVar9] + 2 >> 2);
            puVar14 = puVar14 + 1;
            lVar9 = lVar9 + 2;
          }
        }
        else if (factor == 3) {
          lVar12 = 2;
          lVar9 = 0;
          while( true ) {
            lVar3 = image->width;
            if (lVar3 < lVar9 + 3) break;
            pbVar8 = image->img[lVar6][local_50] + lVar12;
            iVar2 = 0;
            iVar10 = 3;
            while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, bVar16) {
              iVar2 = iVar2 + (uint)pbVar8[-2] + (uint)*pbVar8 + (uint)pbVar8[-1];
              pbVar8 = pbVar8 + lVar3;
            }
            *puVar14 = (uchar)((ulong)(iVar2 + 4) / 9);
            puVar14 = puVar14 + 1;
            lVar12 = lVar12 + 3;
            lVar9 = lVar9 + 3;
          }
        }
        else {
          lVar9 = 0;
          if (factor == 4) {
            while( true ) {
              lVar3 = image->width;
              if (lVar3 < lVar9 + 4) break;
              puVar7 = image->img[lVar6][local_50] + lVar9;
              iVar2 = 0;
              iVar10 = 4;
              while (bVar16 = iVar10 != 0, iVar10 = iVar10 + -1, bVar16) {
                uVar1 = *(undefined4 *)puVar7;
                iVar2 = iVar2 + (uint)(ushort)((ushort)(byte)((uint)uVar1 >> 0x18) +
                                               (ushort)(byte)((uint)uVar1 >> 8) +
                                              (ushort)(byte)((uint)uVar1 >> 0x10) +
                                              ((ushort)uVar1 & 0xff));
                puVar7 = puVar7 + lVar3;
              }
              *puVar14 = (uchar)(iVar2 + 8U >> 4);
              puVar14 = puVar14 + 1;
              lVar9 = lVar9 + 4;
            }
          }
          else {
            while( true ) {
              lVar3 = image->width;
              if (lVar3 < (long)(lVar9 + uVar15)) break;
              puVar7 = image->img[lVar6][local_50] + lVar9;
              iVar10 = 0;
              for (iVar2 = 0; iVar2 != factor; iVar2 = iVar2 + 1) {
                for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
                  iVar10 = iVar10 + (uint)puVar7[uVar13];
                }
                puVar7 = puVar7 + lVar3;
              }
              *puVar14 = (uchar)((iVar10 + (factor * factor >> 1)) / (factor * factor));
              puVar14 = puVar14 + 1;
              lVar9 = lVar9 + uVar15;
            }
          }
        }
        if (lVar9 < lVar3) {
          puVar7 = image->img[lVar6][local_50] + lVar9;
          iVar2 = 0;
          iVar10 = 0;
          for (iVar11 = 0; iVar11 != factor; iVar11 = iVar11 + 1) {
            for (uVar13 = 0; (uVar15 != uVar13 && (lVar3 - lVar9 != uVar13)); uVar13 = uVar13 + 1) {
              iVar2 = iVar2 + (uint)puVar7[uVar13];
            }
            puVar7 = puVar7 + lVar3;
            iVar10 = iVar10 + (int)uVar13;
          }
          *puVar14 = (uchar)(((iVar10 >> 1) + iVar2) / iVar10);
          puVar14 = puVar14 + 1;
        }
      }
      if (local_50 < image->height) {
        lVar5 = 0;
        for (lVar9 = 0; lVar3 = image->width, lVar9 < lVar3; lVar9 = lVar9 + uVar15) {
          puVar7 = image->img[lVar6][local_50] + lVar9;
          iVar2 = 0;
          iVar10 = 0;
          for (uVar13 = 0; (uVar13 < uVar15 && ((long)(uVar13 + local_50) < image->height));
              uVar13 = uVar13 + 1) {
            for (uVar4 = 0; (uVar15 != uVar4 && (lVar3 + lVar5 != uVar4)); uVar4 = uVar4 + 1) {
              iVar2 = iVar2 + (uint)puVar7[uVar4];
            }
            puVar7 = puVar7 + lVar3;
            iVar10 = iVar10 + (int)uVar4;
          }
          *puVar14 = (uchar)(((iVar10 >> 1) + iVar2) / iVar10);
          puVar14 = puVar14 + 1;
          lVar5 = lVar5 - uVar15;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Image<T> downscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  if (factor == 1)
  {
    return image;
  }

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  for (int d=0; d<image.getDepth(); d++)
  {
    T *out=ret.getPtr(0, 0, d);

    long k=0;

    while (k+factor <= image.getHeight())
    {
      long i=0;

      if (factor == 2)
      {
        // speeding up special case of averaging over 2*2 pixels

        while (i+2 <= image.getWidth())
        {
          typename Image<T>::work_t v;

          const T *in=image.getPtr(i, k, d);

          v=*in+in[1];
          in+=image.getWidth();
          v+=*in+in[1];

          *out++=static_cast<typename Image<T>::store_t>((v+2)/4);
          i+=2;
        }
      }
      else if (factor == 3)
      {
        // speeding up special case of averaging over 3*3 pixels

        while (i+3 <= image.getWidth())
        {
          typename Image<T>::work_t v=0;

          const T *in=image.getPtr(i, k, d);

          for (int j=0; j<3; j++)
          {
            v+=*in+in[1]+in[2];
            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+4)/9);
          i+=3;
        }
      }
      else if (factor == 4)
      {
        // speeding up special case of averaging over 4*4 pixels

        while (i+4 <= image.getWidth())
        {
          typename Image<T>::work_t v=0;

          const T *in=image.getPtr(i, k, d);

          for (int j=0; j<4; j++)
          {
            v+=*in+in[1]+in[2]+in[3];
            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+8)/16);
          i+=4;
        }
      }
      else
      {
        // average over factor*factor pixels of the input image

        while (i+factor <= image.getWidth())
        {
          typename Image<T>::work_t v=0;
          int n=0;

          const T *in=image.getPtr(i, k, d);

          for (int kk=0; kk<factor; kk++)
          {
            for (int ii=0; ii<factor; ii++)
            {
              v+=in[ii];
              n++;
            }

            in+=image.getWidth();
          }

          *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
          i+=factor;
        }
      }

      // if there are less than factor pixels left in the image row, then
      // average with boundary check

      if (i < image.getWidth())
      {
        typename Image<T>::work_t v=0;
        int n=0;

        const T *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor; kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            v+=in[ii];
            n++;
          }

          in+=image.getWidth();
        }

        *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
      }

      k+=factor;
    }

    // if there are less than factor image rows left in the image, then
    // average with boundary check

    if (k < image.getHeight())
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        typename Image<T>::work_t v=0;
        int n=0;

        const T *in=image.getPtr(i, k, d);

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            v+=in[ii];
            n++;
          }

          in+=image.getWidth();
        }

        *out++=static_cast<typename Image<T>::store_t>((v+(n>>1))/n);
      }
    }
  }

  return ret;
}